

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

iterator __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,absl::lts_20240722::flat_hash_set<google::protobuf::FileDescriptor_const*,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,absl::lts_20240722::flat_hash_set<google::protobuf::FileDescriptor_const*,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>>>>
::find_non_soo<google::protobuf::FileDescriptor_const*>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,absl::lts_20240722::flat_hash_set<google::protobuf::FileDescriptor_const*,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,absl::lts_20240722::flat_hash_set<google::protobuf::FileDescriptor_const*,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>>>>
           *this,key_arg<const_google::protobuf::FileDescriptor_*> *key,size_t hash)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  char cVar5;
  ctrl_t *pcVar6;
  anon_union_8_1_a8a14541_for_iterator_2 aVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ushort uVar11;
  ulong uVar12;
  __m128i match;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  iterator iVar20;
  char cVar15;
  char cVar17;
  char cVar18;
  char cVar19;
  
  uVar2 = *(ulong *)this;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x145,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar3 = *(ulong *)(this + 0x10);
  uVar9 = hash >> 7 ^ uVar3 >> 0xc;
  auVar13 = ZEXT216(CONCAT11((char)hash,(char)hash) & 0x7f7f);
  auVar13 = pshuflw(auVar13,auVar13,0);
  aVar7 = (anon_union_8_1_a8a14541_for_iterator_2)
          ((anon_union_8_1_a8a14541_for_iterator_2 *)(this + 0x18))->slot_;
  uVar8 = 0;
  do {
    uVar9 = uVar9 & uVar2;
    pcVar1 = (char *)(uVar3 + uVar9);
    cVar5 = pcVar1[0xf];
    cVar15 = auVar13[0];
    auVar16[0] = -(cVar15 == *pcVar1);
    cVar17 = auVar13[1];
    auVar16[1] = -(cVar17 == pcVar1[1]);
    cVar18 = auVar13[2];
    auVar16[2] = -(cVar18 == pcVar1[2]);
    cVar19 = auVar13[3];
    auVar16[3] = -(cVar19 == pcVar1[3]);
    auVar16[4] = -(cVar15 == pcVar1[4]);
    auVar16[5] = -(cVar17 == pcVar1[5]);
    auVar16[6] = -(cVar18 == pcVar1[6]);
    auVar16[7] = -(cVar19 == pcVar1[7]);
    auVar16[8] = -(cVar15 == pcVar1[8]);
    auVar16[9] = -(cVar17 == pcVar1[9]);
    auVar16[10] = -(cVar18 == pcVar1[10]);
    auVar16[0xb] = -(cVar19 == pcVar1[0xb]);
    auVar16[0xc] = -(cVar15 == pcVar1[0xc]);
    auVar16[0xd] = -(cVar17 == pcVar1[0xd]);
    auVar16[0xe] = -(cVar18 == pcVar1[0xe]);
    auVar16[0xf] = -(cVar19 == cVar5);
    uVar11 = (ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe | (ushort)(auVar16[0xf] >> 7) << 0xf;
    uVar10 = (uint)uVar11;
    while (uVar11 != 0) {
      uVar4 = 0;
      if (uVar10 != 0) {
        for (; (uVar10 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar12 = uVar4 + uVar9 & uVar2;
      if (aVar7.slot_[uVar12].value.first == *key) {
        if (uVar3 == 0) {
          __assert_fail("ctrl != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x9c4,
                        "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, absl::flat_hash_set<const google::protobuf::FileDescriptor *>>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FileDescriptor *const, absl::flat_hash_set<const google::protobuf::FileDescriptor *>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, absl::flat_hash_set<const google::protobuf::FileDescriptor *>>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FileDescriptor *const, absl::flat_hash_set<const google::protobuf::FileDescriptor *>>>]"
                       );
        }
        aVar7.slot_ = aVar7.slot_ + uVar12;
        pcVar6 = (ctrl_t *)(uVar3 + uVar12);
        goto LAB_002efc46;
      }
      uVar11 = (ushort)(uVar10 - 1) & (ushort)uVar10;
      uVar10 = CONCAT22((short)(uVar10 - 1 >> 0x10),uVar11);
    }
    auVar14[0] = -(*pcVar1 == -0x80);
    auVar14[1] = -(pcVar1[1] == -0x80);
    auVar14[2] = -(pcVar1[2] == -0x80);
    auVar14[3] = -(pcVar1[3] == -0x80);
    auVar14[4] = -(pcVar1[4] == -0x80);
    auVar14[5] = -(pcVar1[5] == -0x80);
    auVar14[6] = -(pcVar1[6] == -0x80);
    auVar14[7] = -(pcVar1[7] == -0x80);
    auVar14[8] = -(pcVar1[8] == -0x80);
    auVar14[9] = -(pcVar1[9] == -0x80);
    auVar14[10] = -(pcVar1[10] == -0x80);
    auVar14[0xb] = -(pcVar1[0xb] == -0x80);
    auVar14[0xc] = -(pcVar1[0xc] == -0x80);
    auVar14[0xd] = -(pcVar1[0xd] == -0x80);
    auVar14[0xe] = -(pcVar1[0xe] == -0x80);
    auVar14[0xf] = -(cVar5 == -0x80);
    if ((((((((((((((((auVar14 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar14 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar14 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar14 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar14 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar14 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar14 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar14 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar14 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar14 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar14 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar14 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar14 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar14 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar14 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar5 == -0x80) {
      pcVar6 = (ctrl_t *)0x0;
LAB_002efc46:
      iVar20.field_1.slot_ = aVar7.slot_;
      iVar20.ctrl_ = pcVar6;
      return iVar20;
    }
    uVar9 = uVar9 + uVar8 + 0x10;
    uVar8 = uVar8 + 0x10;
    if (uVar2 < uVar8) {
      __assert_fail("seq.index() <= capacity() && \"full table!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xdbd,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, absl::flat_hash_set<const google::protobuf::FileDescriptor *>>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FileDescriptor *const, absl::flat_hash_set<const google::protobuf::FileDescriptor *>>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, absl::flat_hash_set<const google::protobuf::FileDescriptor *>>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FileDescriptor *const, absl::flat_hash_set<const google::protobuf::FileDescriptor *>>>, K = const google::protobuf::FileDescriptor *]"
                   );
    }
  } while( true );
}

Assistant:

iterator find_non_soo(const key_arg<K>& key, size_t hash) {
    assert(!is_soo());
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return iterator_at(seq.offset(i));
      }
      if (ABSL_PREDICT_TRUE(g.MaskEmpty())) return end();
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }